

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void sfImage::preview_image(path *image_path,size_t width)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  bool bVar1;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_139;
  string local_138;
  string local_118;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [16];
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  undefined1 local_c8 [16];
  iterator local_b8;
  size_type local_b0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_a8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_79;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  iterator local_40;
  size_type local_38;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_30;
  size_t local_18;
  size_t width_local;
  path *image_path_local;
  
  local_58 = 0x1f;
  pcStack_50 = "command -v viu > /dev/null 2>&1";
  local_68 = 2;
  pcStack_60 = "-c";
  local_78._M_len = 2;
  local_78._M_str = "sh";
  local_40 = &local_78;
  local_38 = 3;
  local_18 = width;
  width_local = (size_t)image_path;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_79);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_30,__l_00,&local_79);
  bVar1 = sfUtils::taur_exec(&local_30);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_30);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_79);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"viu");
    std::filesystem::__cxx11::path::string(&local_118,(path *)width_local);
    local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"-w");
    std::__cxx11::to_string(&local_138,local_18);
    local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_138);
    local_b8 = &local_f8;
    local_b0 = 4;
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_139);
    __l._M_len = local_b0;
    __l._M_array = local_b8;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_a8,__l,&local_139);
    sfUtils::taur_exec(&local_a8);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector(&local_a8);
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return;
}

Assistant:

void sfImage::preview_image(const std::filesystem::path& image_path, const size_t width) {
  /* Check if `viu` is installed in the system */
  if (sfUtils::taur_exec({ "sh", "-c", "command -v viu > /dev/null 2>&1" })) {
    sfUtils::taur_exec({"viu", image_path.string(), "-w", std::to_string(width)});
  }

  return;
}